

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsMeshAddComponent(FmsMesh mesh,char *comp_name,FmsComponent *comp)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  FmsComponent __ptr;
  char *pcVar4;
  int iVar5;
  FmsComponent *local_40;
  
  if (mesh == (FmsMesh)0x0) {
    return 1;
  }
  if (comp == (FmsComponent *)0x0) {
    return 2;
  }
  uVar1 = mesh->num_comps;
  local_40 = mesh->comps;
  uVar2 = 1;
  do {
    uVar3 = uVar2;
    uVar2 = uVar3 * 2;
  } while (uVar3 < uVar1 + 1);
  if (uVar3 >> 1 < uVar1) {
LAB_0010596f:
    __ptr = (FmsComponent)calloc(1,0x48);
    if (__ptr == (FmsComponent)0x0) {
      return 3;
    }
    iVar5 = 0;
    if (comp_name == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = strdup(comp_name);
      if (pcVar4 == (char *)0x0) {
        free(__ptr);
        goto LAB_001059a9;
      }
    }
    __ptr->name = pcVar4;
    __ptr->id = uVar1;
    __ptr->dim = 0x7f;
    local_40[uVar1] = __ptr;
    mesh->num_comps = uVar1 + 1;
    *comp = __ptr;
  }
  else {
    local_40 = (FmsComponent *)realloc(local_40,uVar3 << 3);
    if (local_40 != (FmsComponent *)0x0) {
      mesh->comps = local_40;
      goto LAB_0010596f;
    }
LAB_001059a9:
    iVar5 = 3;
  }
  return iVar5;
}

Assistant:

int FmsMeshAddComponent(FmsMesh mesh, const char *comp_name,
                        FmsComponent *comp) {
  if (!mesh) { E_RETURN(1); }
  if (!comp) { E_RETURN(2); }
  FmsInt num_comps = mesh->num_comps;
  FmsComponent *comps = mesh->comps;
  // Reallocate mesh->comps, if necessary
  FmsInt nc = NextPow2(num_comps+1);
  if (num_comps <= nc/2) {
    comps = realloc(comps, nc*sizeof(*comps));
    if (comps == NULL) { E_RETURN(3); }
    mesh->comps = comps;
  }
  FmsComponent component;
  component = calloc(1, sizeof(*component));
  if (component == NULL) { E_RETURN(3); }
  // On error, call free(component)
  if (FmsCopyString(comp_name, &component->name)) {
    free(component); E_RETURN(3);
  }
  component->id = num_comps;
  component->dim = FMS_INVALID_DIM;
  comps[num_comps] = component;
  mesh->num_comps = num_comps+1;
  *comp = component;
  return 0;
}